

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_retf(ASMState *as,IRIns *ir)

{
  Reg rr;
  Reg r;
  ASMState *as_00;
  ASMState *in_RSI;
  ASMState *in_RDI;
  int32_t delta;
  void *pc;
  Reg base;
  RegSet in_stack_ffffffffffffffd8;
  IRRef in_stack_ffffffffffffffdc;
  ASMState *in_stack_ffffffffffffffe0;
  Reg in_stack_ffffffffffffffe8;
  
  rr = ra_alloc1(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  as_00 = (ASMState *)(ulong)in_RDI->ir[*(ushort *)((long)in_RSI->cost + 2)].field_1.op12;
  r = (*(uint *)&as_00[-1].field_0x36c >> 8 & 0xff) + 1;
  in_RDI->topslot = in_RDI->topslot - r;
  if ((int)in_RDI->topslot < 0) {
    in_RDI->topslot = 0;
  }
  *(byte *)((long)in_RDI->ir + 0x40004) = *(byte *)((long)in_RDI->ir + 0x40004) | 0x20;
  emit_rma(in_RDI,XO_MOVto,rr,in_RDI->J[-1].bpropcache + 9);
  emit_addptr(as_00,r,in_stack_ffffffffffffffd8);
  asm_guardcc((ASMState *)CONCAT44(rr,in_stack_ffffffffffffffe8),(int)((ulong)as_00 >> 0x20));
  emit_gmroi(in_RSI,rr,in_stack_ffffffffffffffe8,(int32_t)((ulong)as_00 >> 0x20),(int32_t)as_00);
  return;
}

Assistant:

static void asm_retf(ASMState *as, IRIns *ir)
{
  Reg base = ra_alloc1(as, REF_BASE, RSET_GPR);
  void *pc = ir_kptr(IR(ir->op2));
  int32_t delta = 1+bc_a(*((const BCIns *)pc - 1));
  as->topslot -= (BCReg)delta;
  if ((int32_t)as->topslot < 0) as->topslot = 0;
  irt_setmark(IR(REF_BASE)->t);  /* Children must not coalesce with BASE reg. */
  emit_setgl(as, base, jit_base);
  emit_addptr(as, base, -8*delta);
  asm_guardcc(as, CC_NE);
  emit_gmroi(as, XG_ARITHi(XOg_CMP), base, -4, ptr2addr(pc));
}